

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFont::Preload(FFont *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  FTexture *pic;
  int foo;
  int i;
  FFont *this_local;
  
  if (this->FirstChar != this->LastChar) {
    _foo = this;
    for (pic._4_4_ = MAX<int>(this->FirstChar,0x21); uVar1 = pic._4_4_,
        iVar2 = MIN<int>(this->LastChar,0x7e), (int)uVar1 < iVar2; pic._4_4_ = pic._4_4_ + 1) {
      iVar2 = (*this->_vptr_FFont[2])(this,(ulong)pic._4_4_,&pic);
      if ((FTexture *)CONCAT44(extraout_var,iVar2) != (FTexture *)0x0) {
        FTexture::GetNative((FTexture *)CONCAT44(extraout_var,iVar2),false);
      }
    }
  }
  return;
}

Assistant:

void FFont::Preload() const
{
	// First and last char are the same? Wait until it's actually needed
	// since nothing is gained by preloading now.
	if (FirstChar == LastChar)
	{
		return;
	}
	for (int i = MAX(FirstChar, 0x21); i < MIN(LastChar, 0x7e); ++i)
	{
		int foo;
		FTexture *pic = GetChar(i, &foo);
		if (pic != NULL)
		{
			pic->GetNative(false);
		}
	}
}